

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O0

bool __thiscall Control::activate(Control *this,bool makeChange,ostream *msgLog)

{
  double dVar1;
  uint uVar2;
  Link *pLVar3;
  byte bVar4;
  int iVar5;
  string local_220 [32];
  Utilities local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  string local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [8];
  string linkStr;
  allocator local_49;
  string local_48 [8];
  string reason;
  bool result;
  ostream *msgLog_local;
  bool makeChange_local;
  Control *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  (*(this->link->super_Element)._vptr_Element[3])(local_c0);
  std::operator+(local_a0,(char *)local_c0);
  std::operator+(local_80,local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  switch(*(undefined4 *)&(this->super_Element).field_0x2c) {
  case 0:
    std::operator+(local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            s_TankLevel_abi_cxx11_);
    std::__cxx11::string::operator=(local_48,(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    break;
  case 1:
    std::operator+(local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   s_PressureLevel_abi_cxx11_);
    std::__cxx11::string::operator=(local_48,(string *)local_100);
    std::__cxx11::string::~string((string *)local_100);
    break;
  case 2:
    std::__cxx11::string::operator=(local_48,(string *)s_ElapsedTime_abi_cxx11_);
    break;
  case 3:
    std::__cxx11::string::operator=(local_48,(string *)s_TimeOfDay_abi_cxx11_);
  }
  if (this->status == 2) {
    std::operator+(local_1e0,local_80);
    Utilities::to_string<double>(local_200,&this->setting);
    std::operator+(local_1c0,local_1e0);
    std::operator+(local_1a0,local_1c0);
    std::__cxx11::string::operator=(local_48,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::~string((string *)local_1e0);
    pLVar3 = this->link;
    dVar1 = this->setting;
    std::__cxx11::string::string(local_220,local_48);
    iVar5 = (*(pLVar3->super_Element)._vptr_Element[0x1b])
                      (dVar1,pLVar3,(ulong)(makeChange & 1),local_220,msgLog);
    bVar4 = (byte)iVar5;
    std::__cxx11::string::~string(local_220);
  }
  else {
    std::operator+(local_160,local_80);
    std::operator+(local_140,local_160);
    std::operator+(local_120,local_140);
    std::__cxx11::string::operator=(local_48,(string *)local_120);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)local_160);
    pLVar3 = this->link;
    uVar2 = this->status;
    std::__cxx11::string::string(local_180,local_48);
    iVar5 = (*(pLVar3->super_Element)._vptr_Element[0x1a])
                      (pLVar3,(ulong)uVar2,(ulong)(makeChange & 1),local_180,msgLog);
    bVar4 = (byte)iVar5;
    std::__cxx11::string::~string(local_180);
  }
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string(local_48);
  return (bool)(bVar4 & 1);
}

Assistant:

bool Control::activate(bool makeChange, ostream& msgLog)
{
    bool   result = false;
    string reason = "";
    string linkStr = link->typeStr() + " " + link->name;

    switch (type)
    {
    case TANK_LEVEL:
        reason = s_TankLevel + node->name;
        break;

    case PRESSURE_LEVEL:
        reason = s_PressureLevel + node->name;
        break;

    case ELAPSED_TIME:
        reason = s_ElapsedTime;
        break;

    case TIME_OF_DAY:
        reason = s_TimeOfDay;
        break;
    }

    if ( status != NO_STATUS )
    {
        reason =  linkStr + s_StatusChanged + statusTxt[status] + reason;
        result = link->changeStatus(status, makeChange, reason, msgLog);
    }
    else
    {
        reason = linkStr + s_SettingChanged + Utilities::to_string(setting) +
            reason;
        result = link->changeSetting(setting, makeChange, reason, msgLog);
    }
    return result;
}